

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void Console::SetTextColor(Stream stream,Color color,bool bold)

{
  FILE *local_30;
  int local_20;
  undefined1 uStack_19;
  int i;
  char command [8];
  bool bold_local;
  Color color_local;
  Stream stream_local;
  
  stack0xfffffffffffffff4 = stream;
  command._1_4_ = color;
  command[0] = bold;
  if (bold) {
    _uStack_19 = CONCAT26(0x6d,CONCAT15((char)*(undefined4 *)(ansi_color_map + (long)(int)color * 4)
                                        + '0',0x333b315b1b));
  }
  else {
    for (local_20 = 2; local_20 < 6; local_20 = local_20 + 1) {
      (&uStack_19)[local_20] = (&uStack_19)[local_20 + 2];
    }
    _uStack_19 = CONCAT44(0x6d3033,CONCAT13((char)*(undefined4 *)
                                                   (ansi_color_map + (long)(int)command._1_4_ * 4) +
                                            ';',0x315b1b));
  }
  if (stack0xfffffffffffffff4 == STREAM_OUT) {
    local_30 = _stdout;
  }
  else {
    local_30 = _stderr;
  }
  fputs(&uStack_19,local_30);
  return;
}

Assistant:

void SetTextColor(Stream stream, Color color, bool bold)
{
	char command[8] = {27, '[', '1', ';', '3', '0', 'm', 0};

	if (bold)
	{
		command[5] += ansi_color_map[static_cast<int>(color)];
	}
	else
	{
		for (int i = 2; i < 6; ++i)
			command[i] = command[i + 2];

		command[3] += ansi_color_map[static_cast<int>(color)];
	}

	std::fputs(command, (stream == STREAM_OUT) ? stdout : stderr);
}